

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logistic_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::logistic_dist<double>::icdf(logistic_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  int *piVar2;
  result_type_conflict2 rVar3;
  double dVar4;
  
  if ((x < 0.0) || (1.0 < x)) {
    piVar2 = __errno_location();
    *piVar2 = 0x21;
    rVar3 = NAN;
  }
  else if ((x != 0.0) || (NAN(x))) {
    if ((x != 1.0) || (NAN(x))) {
      dVar1 = (this->P).eta_;
      dVar4 = log((1.0 - x) / x);
      rVar3 = dVar1 - dVar4 * (this->P).theta_;
    }
    else {
      rVar3 = INFINITY;
    }
  }
  else {
    rVar3 = -INFINITY;
  }
  return rVar3;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return -math::numeric_limits<result_type>::infinity();
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return icdf_(x);
    }